

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
PyreNet::Layer::calculate
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Layer *this,
          vector<double,_std::allocator<double>_> *input)

{
  pointer pPVar1;
  iterator __position;
  undefined1 auVar2 [8];
  LayerThreadPool *this_00;
  iterator __begin1;
  iterator __end1;
  vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *__range1;
  pointer pPVar3;
  undefined1 local_60 [8];
  LayerQueueJob job;
  Activation local_34;
  int track;
  
  job.track = (int *)input;
  this_00 = LayerThreadPool::getInstance();
  pPVar3 = (this->nodes).
           super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->nodes).
           super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_34._vptr_Activation._0_4_ = (int)((ulong)((long)pPVar1 - (long)pPVar3) >> 3) * -0x33333333;
  auVar2 = local_60;
  local_60 = (undefined1  [8])job.track;
  for (; job.track = (int *)local_60, pPVar1 != pPVar3; pPVar3 = pPVar3 + 1) {
    job.p = (Perceptron *)this->activation;
    job.activation = &local_34;
    job.input = &pPVar3->weights;
    LayerThreadPool::addJob(this_00,(LayerQueueJob *)local_60);
    auVar2 = local_60;
    local_60 = (undefined1  [8])job.track;
  }
  local_60 = auVar2;
  LayerThreadPool::waitForTasks(this_00,(int *)&local_34);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->nodes).
                    super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->nodes).
                    super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  pPVar3 = (this->nodes).
           super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->nodes).
           super__Vector_base<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar3 != pPVar1) {
    do {
      local_60 = (undefined1  [8])Perceptron::getValue(pPVar3);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,__position,(double *)local_60);
      }
      else {
        *__position._M_current = (double)local_60;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Layer::calculate(const std::vector<double> &input) {
        LayerThreadPool* layerThreadPool = LayerThreadPool::getInstance();
        int track = this->nodes.size();
        for (Perceptron &p : this->nodes) {
            LayerThreadPool::LayerQueueJob job(input, p, this->activation, track);
            layerThreadPool->addJob(job);
        }
        layerThreadPool->waitForTasks(track);
        std::vector<double> ans;
        ans.reserve(this->nodes.size());
        for (const Perceptron &p : this->nodes) {
            ans.push_back(p.getValue());
        }
        return ans;
    }